

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O2

bool rest_getutxos(any *context,HTTPRequest *req,string *strURIPart)

{
  long lVar1;
  string_view hex;
  string_view str;
  string str_00;
  string key;
  string key_00;
  string key_01;
  string str_01;
  string str_02;
  string key_02;
  string key_03;
  string str_03;
  string key_04;
  string key_05;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  UniValue val_05;
  UniValue val_06;
  span<const_std::byte,_18446744073709551615UL> reply;
  span<const_std::byte,_18446744073709551615UL> reply_00;
  bool bVar2;
  RESTResponseFormat RVar3;
  const_reference pvVar4;
  pointer pcVar5;
  ChainstateManager *this;
  CTxMemPool *mempoolIn;
  Chainstate *pCVar6;
  CCoinsViewCache *pCVar7;
  size_t i;
  pointer pbVar8;
  char *__s;
  string *psVar9;
  unsigned_long *in_R8;
  ulong uVar10;
  ulong uVar11;
  pointer pbVar12;
  pointer pCVar13;
  long in_FS_OFFSET;
  string_view hex_str;
  Span<const_unsigned_char> s;
  string_view str_04;
  span<const_std::byte,_18446744073709551615UL> reply_01;
  reference rVar14;
  undefined4 uVar15;
  undefined4 in_stack_fffffffffffff744;
  undefined4 uVar16;
  pointer in_stack_fffffffffffff748;
  pointer in_stack_fffffffffffff750;
  any *local_8a8;
  undefined4 uStack_8a0;
  int active_height;
  vector<CCoin,_std::allocator<CCoin>_> outs;
  undefined8 uStack_880;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bitmap;
  undefined8 uStack_860;
  vector<COutPoint,_std::allocator<COutPoint>_> vOutPoints;
  bool fCheckMemPool;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uriParts;
  vector<bool,_std::allocator<bool>_> hits;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  string local_7d0;
  UniValue local_7b0;
  string local_758 [32];
  UniValue local_738;
  UniValue local_6e0;
  string local_688 [32];
  undefined1 *local_668;
  undefined8 local_660;
  undefined1 local_658 [16];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniValue local_5f0;
  string local_598 [32];
  UniValue local_578;
  string local_520 [32];
  undefined1 *local_500;
  undefined8 local_4f8;
  undefined1 local_4f0 [16];
  optional<unsigned_int> output;
  __extent_storage<18446744073709551615UL> local_4d8;
  undefined1 *local_488;
  undefined8 local_480;
  undefined1 local_478 [16];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  txid_out;
  UniValue local_410;
  string local_3b8 [32];
  UniValue local_398;
  string local_340 [32];
  UniValue local_320;
  string local_2c8 [32];
  undefined1 *local_2a8;
  undefined8 local_2a0;
  undefined1 local_298 [16];
  string strUriParams;
  undefined1 local_268;
  uint256 active_hash;
  string bitmapStringRepresentation;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158 [2];
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string strRequestMutable;
  string param;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CheckWarmup(req);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_007d1f06;
  }
  param._M_dataplus._M_p = (pointer)&param.field_2;
  param._M_string_length = 0;
  param.field_2._M_local_buf[0] = '\0';
  RVar3 = ParseDataFormat(&param,strURIPart);
  uriParts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uriParts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  uriParts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (1 < param._M_string_length) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&strUriParams,&param,1,0xffffffffffffffff);
    str_04._M_str = (char *)0x2f;
    str_04._M_len = (size_t)strUriParams._M_dataplus._M_p;
    util::SplitString_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&txid_out,(util *)strUriParams._M_string_length,str_04,(char)in_R8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&uriParts,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&txid_out);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&txid_out);
    std::__cxx11::string::~string((string *)&strUriParams);
  }
  HTTPRequest::ReadBody_abi_cxx11_(&strRequestMutable,req);
  pbVar12 = uriParts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar8 = uriParts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uriParts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      uriParts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start && strRequestMutable._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Error: empty request",(allocator<char> *)&strUriParams);
    RESTERR(req,HTTP_BAD_REQUEST,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    bVar2 = false;
  }
  else {
    fCheckMemPool = false;
    vOutPoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vOutPoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vOutPoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (uriParts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        uriParts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      bVar2 = std::operator==(uriParts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,"checkmempool");
      if (bVar2) {
        uVar11 = 1;
        fCheckMemPool = true;
      }
      else {
        uVar11 = (ulong)fCheckMemPool;
      }
      uVar10 = (ulong)(uint)((int)uVar11 << 5) | 8;
      for (; uVar11 < (ulong)((long)uriParts.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)uriParts.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar11 = uVar11 + 1) {
        strUriParams._M_dataplus._M_p =
             *(pointer *)
              ((long)uriParts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (uVar10 - 8));
        strUriParams._M_string_length =
             *(size_type *)
              ((long)&((uriParts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar10);
        util::Split<std::basic_string_view<char,std::char_traits<char>>>
                  ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)&txid_out.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ,(util *)&strUriParams,(Span<const_char> *)0x2d,
                   (char)strUriParams._M_dataplus._M_p);
        if ((long)txid_out.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)txid_out.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0x20) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"Parse error",(allocator<char> *)&strUriParams);
          RESTERR(req,HTTP_BAD_REQUEST,&local_b8);
          psVar9 = &local_b8;
LAB_007d1cfb:
          std::__cxx11::string::~string((string *)psVar9);
          std::
          _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::~_Vector_base(&txid_out.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         );
          goto LAB_007d1ed3;
        }
        pvVar4 = std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::at((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)&txid_out.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ,0);
        hex._M_len = pvVar4->_M_len;
        hex._M_str = pvVar4->_M_str;
        transaction_identifier<false>::FromHex
                  ((optional<transaction_identifier<false>_> *)&strUriParams,hex);
        pvVar4 = std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::at((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)&txid_out.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ,1);
        str._M_len = pvVar4->_M_len;
        str._M_str = pvVar4->_M_str;
        output = ToIntegral<unsigned_int>(str);
        if ((local_268 != '\x01') ||
           (((ulong)output.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0x100000000) == 0)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,"Parse error",(allocator<char> *)&criticalblock2);
          RESTERR(req,HTTP_BAD_REQUEST,&local_d8);
          psVar9 = &local_d8;
          goto LAB_007d1cfb;
        }
        std::vector<COutPoint,std::allocator<COutPoint>>::
        emplace_back<transaction_identifier<false>&,unsigned_int&>
                  ((vector<COutPoint,std::allocator<COutPoint>> *)&vOutPoints,
                   (transaction_identifier<false> *)&strUriParams,(uint *)&output);
        std::
        _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::~_Vector_base(&txid_out.
                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       );
        uVar10 = uVar10 + 0x20;
      }
      in_stack_fffffffffffff748 = pbVar12;
      in_stack_fffffffffffff750 = pbVar8;
      local_8a8 = context;
      if (vOutPoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          vOutPoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_007d1bcc;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"Error: empty request",(allocator<char> *)&strUriParams);
      RESTERR(req,HTTP_BAD_REQUEST,&local_f8);
      psVar9 = &local_f8;
      goto LAB_007d1ece;
    }
LAB_007d1bcc:
    if (RVar3 == BINARY) {
LAB_007d1c2e:
      if (strRequestMutable._M_string_length != 0) {
        if (pbVar12 != pbVar8) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_118,
                     "Combination of URI scheme inputs and raw post data is not allowed",
                     (allocator<char> *)&strUriParams);
          RESTERR(req,HTTP_BAD_REQUEST,&local_118);
          psVar9 = &local_118;
          goto LAB_007d1ece;
        }
        strUriParams.field_2._M_allocated_capacity = 0;
        strUriParams.field_2._8_8_ = 0;
        strUriParams._M_dataplus._M_p = (pointer)0x0;
        strUriParams._M_string_length = 0;
        Serialize<DataStream,char>((DataStream *)&strUriParams,&strRequestMutable);
        Unserialize<DataStream>((DataStream *)&strUriParams,&fCheckMemPool);
        Unserialize<DataStream,COutPoint,std::allocator<COutPoint>>
                  ((DataStream *)&strUriParams,&vOutPoints);
        std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                  ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&strUriParams);
      }
LAB_007d1e6e:
      pcVar5 = (pointer)(((long)vOutPoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)vOutPoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x24);
      if ((pointer)0xf < pcVar5) {
        strUriParams._M_dataplus._M_p = pcVar5;
        tinyformat::format<unsigned_long,unsigned_long>
                  (&local_198,(tinyformat *)"Error: max outpoints exceeded (max: %d, tried: %d)",
                   "\x0f",(unsigned_long *)&strUriParams,in_R8);
        RESTERR(req,HTTP_BAD_REQUEST,&local_198);
        psVar9 = &local_198;
        goto LAB_007d1ece;
      }
      bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      bitmapStringRepresentation._M_dataplus._M_p = (pointer)&bitmapStringRepresentation.field_2;
      bitmapStringRepresentation._M_string_length = 0;
      hits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      hits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      hits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      hits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_offset = 0;
      bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      hits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      bitmapStringRepresentation.field_2._M_local_buf[0] = '\0';
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&bitmap,(ulong)(pcVar5 + 7) >> 3);
      this = GetChainman(context,req);
      if (this == (ChainstateManager *)0x0) {
LAB_007d2887:
        bVar2 = false;
      }
      else {
        active_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        txid_out.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&vOutPoints;
        txid_out.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)&outs;
        txid_out.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&hits;
        if (fCheckMemPool == true) {
          mempoolIn = GetMemPool(context,req);
          if (mempoolIn == (CTxMemPool *)0x0) goto LAB_007d2887;
          UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                    ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&output,&cs_main,"cs_main"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rest.cpp"
                     ,0x373,false);
          UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                    (&criticalblock2,&mempoolIn->cs,"mempool->cs",
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rest.cpp"
                     ,0x373,false);
          pCVar6 = ChainstateManager::ActiveChainstate(this);
          pCVar7 = Chainstate::CoinsTip(pCVar6);
          CCoinsViewMemPool::CCoinsViewMemPool
                    ((CCoinsViewMemPool *)&strUriParams,(CCoinsView *)pCVar7,mempoolIn);
          rest_getutxos::anon_class_48_6_125dcb17::operator()
                    ((anon_class_48_6_125dcb17 *)&txid_out,(CCoinsView *)&strUriParams,mempoolIn);
          CCoinsViewMemPool::~CCoinsViewMemPool((CCoinsViewMemPool *)&strUriParams);
          std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
          psVar9 = (string *)&output;
        }
        else {
          UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                    ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&strUriParams,&cs_main,
                     "cs_main",
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rest.cpp"
                     ,0x378,false);
          pCVar6 = ChainstateManager::ActiveChainstate(this);
          pCVar7 = Chainstate::CoinsTip(pCVar6);
          rest_getutxos::anon_class_48_6_125dcb17::operator()
                    ((anon_class_48_6_125dcb17 *)&txid_out,(CCoinsView *)pCVar7,(CTxMemPool *)0x0);
          psVar9 = &strUriParams;
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)psVar9);
        for (uVar11 = 0;
            uVar11 < (ulong)hits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                     ((long)hits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)hits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
            uVar11 = uVar11 + 1) {
          rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](&hits,uVar11);
          uVar10 = rVar14._M_mask & *rVar14._M_p;
          __s = "0";
          if (uVar10 != 0) {
            __s = "1";
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&bitmapStringRepresentation,__s);
          bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11 >> 3] =
               bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar11 >> 3] | (uVar10 != 0) << ((byte)uVar11 & 7);
        }
        if (RVar3 == BINARY) {
          strUriParams.field_2._M_allocated_capacity = 0;
          strUriParams.field_2._8_8_ = 0;
          strUriParams._M_dataplus._M_p = (pointer)0x0;
          strUriParams._M_string_length = 0;
          ser_writedata32<DataStream>((DataStream *)&strUriParams,active_height);
          base_blob<256U>::Serialize<DataStream>
                    (&active_hash.super_base_blob<256U>,(DataStream *)&strUriParams);
          Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
                    ((DataStream *)&strUriParams,&bitmap);
          Serialize<DataStream,CCoin,std::allocator<CCoin>>((DataStream *)&strUriParams,&outs);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&txid_out,"Content-Type",(allocator<char> *)&criticalblock2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&output,"application/octet-stream",(allocator<char> *)&local_7d0);
          HTTPRequest::WriteHeader(req,(string *)&txid_out,(string *)&output);
          std::__cxx11::string::~string((string *)&output);
          std::__cxx11::string::~string((string *)&txid_out);
          reply_01._M_ptr = (pointer)(strUriParams._M_dataplus._M_p + strUriParams.field_2._8_8_);
          reply_01._M_extent._M_extent_value = strUriParams._M_string_length - (long)reply_01._M_ptr
          ;
          HTTPRequest::WriteReply(req,200,reply_01);
LAB_007d27f3:
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&strUriParams
                    );
        }
        else {
          if (RVar3 == HEX) {
            strUriParams.field_2._M_allocated_capacity = 0;
            strUriParams.field_2._8_8_ = 0;
            strUriParams._M_dataplus._M_p = (pointer)0x0;
            strUriParams._M_string_length = 0;
            ser_writedata32<DataStream>((DataStream *)&strUriParams,active_height);
            base_blob<256U>::Serialize<DataStream>
                      (&active_hash.super_base_blob<256U>,(DataStream *)&strUriParams);
            Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
                      ((DataStream *)&strUriParams,&bitmap);
            Serialize<DataStream,CCoin,std::allocator<CCoin>>((DataStream *)&strUriParams,&outs);
            s.m_data = (uchar *)(strUriParams._M_dataplus._M_p + strUriParams.field_2._8_8_);
            s.m_size = strUriParams._M_string_length - (long)s.m_data;
            HexStr_abi_cxx11_((string *)&output,s);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &txid_out,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &output,"\n");
            std::__cxx11::string::~string((string *)&output);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&output,"Content-Type",(allocator<char> *)&local_7d0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&criticalblock2,"text/plain",
                       (allocator<char> *)((long)&uStack_8a0 + 3));
            HTTPRequest::WriteHeader(req,(string *)&output,(string *)&criticalblock2);
            std::__cxx11::string::~string((string *)&criticalblock2);
            std::__cxx11::string::~string((string *)&output);
            reply_00._M_extent._M_extent_value =
                 (size_t)txid_out.
                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            reply_00._M_ptr =
                 (pointer)txid_out.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            HTTPRequest::WriteReply(req,200,reply_00);
            std::__cxx11::string::~string((string *)&txid_out);
            goto LAB_007d27f3;
          }
          if (RVar3 != JSON) {
            AvailableDataFormatsString_abi_cxx11_();
            std::operator+(&strUriParams,"output format not found (available: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &txid_out);
            std::operator+(&local_7f0,&strUriParams,")");
            RESTERR(req,HTTP_NOT_FOUND,&local_7f0);
            std::__cxx11::string::~string((string *)&local_7f0);
            std::__cxx11::string::~string((string *)&strUriParams);
            std::__cxx11::string::~string((string *)&txid_out);
            goto LAB_007d2887;
          }
          local_2a8 = local_298;
          local_2a0 = 0;
          local_298[0] = 0;
          str_00._M_string_length._0_4_ = 3;
          str_00._M_dataplus._M_p = (pointer)req;
          str_00._M_string_length._4_4_ = in_stack_fffffffffffff744;
          str_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff748;
          str_00.field_2._8_8_ = in_stack_fffffffffffff750;
          UniValue::UniValue((UniValue *)&strUriParams,VOBJ,str_00);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_2c8,"chainHeight",(allocator<char> *)&txid_out);
          UniValue::UniValue<int_&,_int,_true>(&local_320,&active_height);
          key._M_string_length._0_4_ = RVar3;
          key._M_dataplus._M_p = (pointer)req;
          key._M_string_length._4_4_ = in_stack_fffffffffffff744;
          key.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff748;
          key.field_2._8_8_ = in_stack_fffffffffffff750;
          val_00.val._M_dataplus._M_p._0_4_ = uStack_8a0;
          val_00._0_8_ = local_8a8;
          val_00.val._M_dataplus._M_p._4_4_ = active_height;
          val_00.val._M_string_length =
               (size_type)
               outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
               super__Vector_impl_data._M_start;
          val_00.val.field_2._M_allocated_capacity =
               (size_type)
               outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
               super__Vector_impl_data._M_finish;
          val_00.val.field_2._8_8_ =
               outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          val_00.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_880;
          val_00.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          val_00.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
          val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
          val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)uStack_860;
          val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)vOutPoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl
                        .super__Vector_impl_data._M_start;
          UniValue::pushKV((UniValue *)&strUriParams,key,val_00);
          UniValue::~UniValue(&local_320);
          std::__cxx11::string::~string(local_2c8);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_340,"chaintipHash",(allocator<char> *)&output);
          base_blob<256u>::GetHex_abi_cxx11_((string *)&txid_out,(base_blob<256u> *)&active_hash);
          UniValue::
          UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_398,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&txid_out)
          ;
          key_00._M_string_length._0_4_ = RVar3;
          key_00._M_dataplus._M_p = (pointer)req;
          key_00._M_string_length._4_4_ = in_stack_fffffffffffff744;
          key_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff748;
          key_00.field_2._8_8_ = in_stack_fffffffffffff750;
          val_01.val._M_dataplus._M_p._0_4_ = uStack_8a0;
          val_01._0_8_ = local_8a8;
          val_01.val._M_dataplus._M_p._4_4_ = active_height;
          val_01.val._M_string_length =
               (size_type)
               outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
               super__Vector_impl_data._M_start;
          val_01.val.field_2._M_allocated_capacity =
               (size_type)
               outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
               super__Vector_impl_data._M_finish;
          val_01.val.field_2._8_8_ =
               outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          val_01.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_880;
          val_01.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          val_01.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
          val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
          val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)uStack_860;
          val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)vOutPoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl
                        .super__Vector_impl_data._M_start;
          UniValue::pushKV((UniValue *)&strUriParams,key_00,val_01);
          UniValue::~UniValue(&local_398);
          std::__cxx11::string::~string((string *)&txid_out);
          std::__cxx11::string::~string(local_340);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_3b8,"bitmap",(allocator<char> *)&txid_out);
          UniValue::
          UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_410,&bitmapStringRepresentation);
          key_01._M_string_length._0_4_ = RVar3;
          key_01._M_dataplus._M_p = (pointer)req;
          key_01._M_string_length._4_4_ = in_stack_fffffffffffff744;
          key_01.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff748;
          key_01.field_2._8_8_ = in_stack_fffffffffffff750;
          val_02.val._M_dataplus._M_p._0_4_ = uStack_8a0;
          val_02._0_8_ = local_8a8;
          val_02.val._M_dataplus._M_p._4_4_ = active_height;
          val_02.val._M_string_length =
               (size_type)
               outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
               super__Vector_impl_data._M_start;
          val_02.val.field_2._M_allocated_capacity =
               (size_type)
               outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
               super__Vector_impl_data._M_finish;
          val_02.val.field_2._8_8_ =
               outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          val_02.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_880;
          val_02.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          val_02.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
          val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
          val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)uStack_860;
          val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)vOutPoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl
                        .super__Vector_impl_data._M_start;
          UniValue::pushKV((UniValue *)&strUriParams,key_01,val_02);
          UniValue::~UniValue(&local_410);
          std::__cxx11::string::~string(local_3b8);
          local_488 = local_478;
          local_480 = 0;
          local_478[0] = 0;
          str_01._M_string_length._0_4_ = RVar3;
          str_01._M_dataplus._M_p = (pointer)req;
          str_01._M_string_length._4_4_ = in_stack_fffffffffffff744;
          str_01.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff748;
          str_01.field_2._8_8_ = in_stack_fffffffffffff750;
          UniValue::UniValue((UniValue *)&txid_out,VARR,str_01);
          std::__cxx11::string::~string((string *)&local_488);
          uVar15 = SUB84(outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
                         super__Vector_impl_data._M_finish,0);
          uVar16 = (undefined4)
                   ((ulong)outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
                           super__Vector_impl_data._M_finish >> 0x20);
          for (pCVar13 = outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
                         super__Vector_impl_data._M_start;
              pCVar13 != (pointer)CONCAT44(uVar16,uVar15); pCVar13 = pCVar13 + 1) {
            local_500 = local_4f0;
            local_4f8 = 0;
            local_4f0[0] = 0;
            str_02._M_string_length._0_4_ = uVar15;
            str_02._M_dataplus._M_p = (pointer)req;
            str_02._M_string_length._4_4_ = uVar16;
            str_02.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff748;
            str_02.field_2._8_8_ = in_stack_fffffffffffff750;
            UniValue::UniValue((UniValue *)&output,VOBJ,str_02);
            std::__cxx11::string::~string((string *)&local_500);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_520,"height",(allocator<char> *)&local_7d0);
            criticalblock2.super_unique_lock._M_device._0_4_ = pCVar13->nHeight;
            UniValue::UniValue<int,_int,_true>(&local_578,(int *)&criticalblock2);
            key_02._M_string_length._0_4_ = uVar15;
            key_02._M_dataplus._M_p = (pointer)req;
            key_02._M_string_length._4_4_ = uVar16;
            key_02.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff748;
            key_02.field_2._8_8_ = in_stack_fffffffffffff750;
            val_03.val._M_dataplus._M_p._0_4_ = uStack_8a0;
            val_03._0_8_ = local_8a8;
            val_03.val._M_dataplus._M_p._4_4_ = active_height;
            val_03.val._M_string_length =
                 (size_type)
                 outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
                 super__Vector_impl_data._M_start;
            val_03.val.field_2._M_allocated_capacity =
                 (size_type)
                 outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            val_03.val.field_2._8_8_ =
                 outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            val_03.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_880;
            val_03.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            val_03.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
            val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
            val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)uStack_860;
            val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)vOutPoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            UniValue::pushKV((UniValue *)&output,key_02,val_03);
            UniValue::~UniValue(&local_578);
            std::__cxx11::string::~string(local_520);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_598,"value",(allocator<char> *)&criticalblock2);
            ValueFromAmount(&local_5f0,(pCVar13->out).nValue);
            key_03._M_string_length._0_4_ = uVar15;
            key_03._M_dataplus._M_p = (pointer)req;
            key_03._M_string_length._4_4_ = uVar16;
            key_03.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff748;
            key_03.field_2._8_8_ = in_stack_fffffffffffff750;
            val_04.val._M_dataplus._M_p._0_4_ = uStack_8a0;
            val_04._0_8_ = local_8a8;
            val_04.val._M_dataplus._M_p._4_4_ = active_height;
            val_04.val._M_string_length =
                 (size_type)
                 outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
                 super__Vector_impl_data._M_start;
            val_04.val.field_2._M_allocated_capacity =
                 (size_type)
                 outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            val_04.val.field_2._8_8_ =
                 outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            val_04.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_880;
            val_04.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            val_04.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
            val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
            val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)uStack_860;
            val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)vOutPoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            UniValue::pushKV((UniValue *)&output,key_03,val_04);
            UniValue::~UniValue(&local_5f0);
            std::__cxx11::string::~string(local_598);
            local_668 = local_658;
            local_660 = 0;
            local_658[0] = 0;
            str_03._M_string_length._0_4_ = uVar15;
            str_03._M_dataplus._M_p = (pointer)req;
            str_03._M_string_length._4_4_ = uVar16;
            str_03.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff748;
            str_03.field_2._8_8_ = in_stack_fffffffffffff750;
            UniValue::UniValue((UniValue *)&criticalblock2,VOBJ,str_03);
            std::__cxx11::string::~string((string *)&local_668);
            ScriptToUniv(&(pCVar13->out).scriptPubKey,(UniValue *)&criticalblock2,true,true,
                         (SigningProvider *)0x0);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_688,"scriptPubKey",(allocator<char> *)&local_7d0);
            UniValue::UniValue(&local_6e0,(UniValue *)&criticalblock2);
            key_04._M_string_length._0_4_ = uVar15;
            key_04._M_dataplus._M_p = (pointer)req;
            key_04._M_string_length._4_4_ = uVar16;
            key_04.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff748;
            key_04.field_2._8_8_ = in_stack_fffffffffffff750;
            val_05.val._M_dataplus._M_p._0_4_ = uStack_8a0;
            val_05._0_8_ = local_8a8;
            val_05.val._M_dataplus._M_p._4_4_ = active_height;
            val_05.val._M_string_length =
                 (size_type)
                 outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
                 super__Vector_impl_data._M_start;
            val_05.val.field_2._M_allocated_capacity =
                 (size_type)
                 outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            val_05.val.field_2._8_8_ =
                 outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            val_05.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_880;
            val_05.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            val_05.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
            val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
            val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)uStack_860;
            val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)vOutPoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            UniValue::pushKV((UniValue *)&output,key_04,val_05);
            UniValue::~UniValue(&local_6e0);
            std::__cxx11::string::~string(local_688);
            UniValue::UniValue(&local_738,(UniValue *)&output);
            val.val._M_dataplus._M_p._0_4_ = uVar15;
            val._0_8_ = req;
            val.val._M_dataplus._M_p._4_4_ = uVar16;
            val.val._M_string_length = (size_type)in_stack_fffffffffffff748;
            val.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff750;
            val.val.field_2._8_8_ = local_8a8;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = uStack_8a0;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start._4_4_ = active_height;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
                          super__Vector_impl_data._M_start;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
                          super__Vector_impl_data._M_finish;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)uStack_880;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            UniValue::push_back((UniValue *)&txid_out,val);
            UniValue::~UniValue(&local_738);
            UniValue::~UniValue((UniValue *)&criticalblock2);
            UniValue::~UniValue((UniValue *)&output);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    (local_758,"utxos",(allocator<char> *)&output);
          UniValue::UniValue(&local_7b0,(UniValue *)&txid_out);
          key_05._M_string_length._0_4_ = uVar15;
          key_05._M_dataplus._M_p = (pointer)req;
          key_05._M_string_length._4_4_ = uVar16;
          key_05.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff748;
          key_05.field_2._8_8_ = in_stack_fffffffffffff750;
          val_06.val._M_dataplus._M_p._0_4_ = uStack_8a0;
          val_06._0_8_ = local_8a8;
          val_06.val._M_dataplus._M_p._4_4_ = active_height;
          val_06.val._M_string_length =
               (size_type)
               outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
               super__Vector_impl_data._M_start;
          val_06.val.field_2._M_allocated_capacity =
               (size_type)
               outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
               super__Vector_impl_data._M_finish;
          val_06.val.field_2._8_8_ =
               outs.super__Vector_base<CCoin,_std::allocator<CCoin>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          val_06.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_880;
          val_06.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          val_06.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
          val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
          val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)uStack_860;
          val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)vOutPoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl
                        .super__Vector_impl_data._M_start;
          UniValue::pushKV((UniValue *)&strUriParams,key_05,val_06);
          UniValue::~UniValue(&local_7b0);
          std::__cxx11::string::~string(local_758);
          UniValue::write_abi_cxx11_((UniValue *)&criticalblock2,(int)&strUriParams,(void *)0x0,0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &output,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&criticalblock2,"\n");
          std::__cxx11::string::~string((string *)&criticalblock2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&criticalblock2,"Content-Type",
                     (allocator<char> *)((long)&uStack_8a0 + 3));
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7d0,"application/json",
                     (allocator<char> *)((long)&uStack_8a0 + 2));
          HTTPRequest::WriteHeader(req,(string *)&criticalblock2,&local_7d0);
          std::__cxx11::string::~string((string *)&local_7d0);
          std::__cxx11::string::~string((string *)&criticalblock2);
          reply._M_extent._M_extent_value = local_4d8._M_extent_value;
          reply._M_ptr = (pointer)output.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                  super__Optional_payload_base<unsigned_int>;
          HTTPRequest::WriteReply(req,200,reply);
          std::__cxx11::string::~string((string *)&output);
          UniValue::~UniValue((UniValue *)&txid_out);
          UniValue::~UniValue((UniValue *)&strUriParams);
        }
        bVar2 = true;
      }
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&hits.super__Bvector_base<std::allocator<bool>_>);
      std::__cxx11::string::~string((string *)&bitmapStringRepresentation);
      std::vector<CCoin,_std::allocator<CCoin>_>::~vector(&outs);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    else {
      if (RVar3 == JSON) {
        if (pbVar12 != pbVar8) goto LAB_007d1e6e;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_158,"Error: empty request",(allocator<char> *)&strUriParams);
        RESTERR(req,HTTP_BAD_REQUEST,local_158);
        psVar9 = local_158;
      }
      else {
        if (RVar3 == HEX) {
          hex_str._M_str = strRequestMutable._M_dataplus._M_p;
          hex_str._M_len = strRequestMutable._M_string_length;
          ParseHex<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&strUriParams,hex_str)
          ;
          std::__cxx11::string::
          assign<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    ((string *)&strRequestMutable,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )strUriParams._M_dataplus._M_p,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )strUriParams._M_string_length);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&strUriParams);
          goto LAB_007d1c2e;
        }
        AvailableDataFormatsString_abi_cxx11_();
        std::operator+(&strUriParams,"output format not found (available: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &txid_out);
        std::operator+(&local_178,&strUriParams,")");
        RESTERR(req,HTTP_NOT_FOUND,&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&strUriParams);
        psVar9 = (string *)&txid_out;
      }
LAB_007d1ece:
      std::__cxx11::string::~string((string *)psVar9);
LAB_007d1ed3:
      bVar2 = false;
    }
    std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
              (&vOutPoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>);
  }
  std::__cxx11::string::~string((string *)&strRequestMutable);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&uriParts);
  std::__cxx11::string::~string((string *)&param);
LAB_007d1f06:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool rest_getutxos(const std::any& context, HTTPRequest* req, const std::string& strURIPart)
{
    if (!CheckWarmup(req))
        return false;
    std::string param;
    const RESTResponseFormat rf = ParseDataFormat(param, strURIPart);

    std::vector<std::string> uriParts;
    if (param.length() > 1)
    {
        std::string strUriParams = param.substr(1);
        uriParts = SplitString(strUriParams, '/');
    }

    // throw exception in case of an empty request
    std::string strRequestMutable = req->ReadBody();
    if (strRequestMutable.length() == 0 && uriParts.size() == 0)
        return RESTERR(req, HTTP_BAD_REQUEST, "Error: empty request");

    bool fInputParsed = false;
    bool fCheckMemPool = false;
    std::vector<COutPoint> vOutPoints;

    // parse/deserialize input
    // input-format = output-format, rest/getutxos/bin requires binary input, gives binary output, ...

    if (uriParts.size() > 0)
    {
        //inputs is sent over URI scheme (/rest/getutxos/checkmempool/txid1-n/txid2-n/...)
        if (uriParts[0] == "checkmempool") fCheckMemPool = true;

        for (size_t i = (fCheckMemPool) ? 1 : 0; i < uriParts.size(); i++)
        {
            const auto txid_out{util::Split<std::string_view>(uriParts[i], '-')};
            if (txid_out.size() != 2) {
                return RESTERR(req, HTTP_BAD_REQUEST, "Parse error");
            }
            auto txid{Txid::FromHex(txid_out.at(0))};
            auto output{ToIntegral<uint32_t>(txid_out.at(1))};

            if (!txid || !output) {
                return RESTERR(req, HTTP_BAD_REQUEST, "Parse error");
            }

            vOutPoints.emplace_back(*txid, *output);
        }

        if (vOutPoints.size() > 0)
            fInputParsed = true;
        else
            return RESTERR(req, HTTP_BAD_REQUEST, "Error: empty request");
    }

    switch (rf) {
    case RESTResponseFormat::HEX: {
        // convert hex to bin, continue then with bin part
        std::vector<unsigned char> strRequestV = ParseHex(strRequestMutable);
        strRequestMutable.assign(strRequestV.begin(), strRequestV.end());
        [[fallthrough]];
    }

    case RESTResponseFormat::BINARY: {
        try {
            //deserialize only if user sent a request
            if (strRequestMutable.size() > 0)
            {
                if (fInputParsed) //don't allow sending input over URI and HTTP RAW DATA
                    return RESTERR(req, HTTP_BAD_REQUEST, "Combination of URI scheme inputs and raw post data is not allowed");

                DataStream oss{};
                oss << strRequestMutable;
                oss >> fCheckMemPool;
                oss >> vOutPoints;
            }
        } catch (const std::ios_base::failure&) {
            // abort in case of unreadable binary data
            return RESTERR(req, HTTP_BAD_REQUEST, "Parse error");
        }
        break;
    }

    case RESTResponseFormat::JSON: {
        if (!fInputParsed)
            return RESTERR(req, HTTP_BAD_REQUEST, "Error: empty request");
        break;
    }
    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: " + AvailableDataFormatsString() + ")");
    }
    }

    // limit max outpoints
    if (vOutPoints.size() > MAX_GETUTXOS_OUTPOINTS)
        return RESTERR(req, HTTP_BAD_REQUEST, strprintf("Error: max outpoints exceeded (max: %d, tried: %d)", MAX_GETUTXOS_OUTPOINTS, vOutPoints.size()));

    // check spentness and form a bitmap (as well as a JSON capable human-readable string representation)
    std::vector<unsigned char> bitmap;
    std::vector<CCoin> outs;
    std::string bitmapStringRepresentation;
    std::vector<bool> hits;
    bitmap.resize((vOutPoints.size() + 7) / 8);
    ChainstateManager* maybe_chainman = GetChainman(context, req);
    if (!maybe_chainman) return false;
    ChainstateManager& chainman = *maybe_chainman;
    decltype(chainman.ActiveHeight()) active_height;
    uint256 active_hash;
    {
        auto process_utxos = [&vOutPoints, &outs, &hits, &active_height, &active_hash, &chainman](const CCoinsView& view, const CTxMemPool* mempool) EXCLUSIVE_LOCKS_REQUIRED(chainman.GetMutex()) {
            for (const COutPoint& vOutPoint : vOutPoints) {
                Coin coin;
                bool hit = (!mempool || !mempool->isSpent(vOutPoint)) && view.GetCoin(vOutPoint, coin);
                hits.push_back(hit);
                if (hit) outs.emplace_back(std::move(coin));
            }
            active_height = chainman.ActiveHeight();
            active_hash = chainman.ActiveTip()->GetBlockHash();
        };

        if (fCheckMemPool) {
            const CTxMemPool* mempool = GetMemPool(context, req);
            if (!mempool) return false;
            // use db+mempool as cache backend in case user likes to query mempool
            LOCK2(cs_main, mempool->cs);
            CCoinsViewCache& viewChain = chainman.ActiveChainstate().CoinsTip();
            CCoinsViewMemPool viewMempool(&viewChain, *mempool);
            process_utxos(viewMempool, mempool);
        } else {
            LOCK(cs_main);
            process_utxos(chainman.ActiveChainstate().CoinsTip(), nullptr);
        }

        for (size_t i = 0; i < hits.size(); ++i) {
            const bool hit = hits[i];
            bitmapStringRepresentation.append(hit ? "1" : "0"); // form a binary string representation (human-readable for json output)
            bitmap[i / 8] |= ((uint8_t)hit) << (i % 8);
        }
    }

    switch (rf) {
    case RESTResponseFormat::BINARY: {
        // serialize data
        // use exact same output as mentioned in Bip64
        DataStream ssGetUTXOResponse{};
        ssGetUTXOResponse << active_height << active_hash << bitmap << outs;

        req->WriteHeader("Content-Type", "application/octet-stream");
        req->WriteReply(HTTP_OK, ssGetUTXOResponse);
        return true;
    }

    case RESTResponseFormat::HEX: {
        DataStream ssGetUTXOResponse{};
        ssGetUTXOResponse << active_height << active_hash << bitmap << outs;
        std::string strHex = HexStr(ssGetUTXOResponse) + "\n";

        req->WriteHeader("Content-Type", "text/plain");
        req->WriteReply(HTTP_OK, strHex);
        return true;
    }

    case RESTResponseFormat::JSON: {
        UniValue objGetUTXOResponse(UniValue::VOBJ);

        // pack in some essentials
        // use more or less the same output as mentioned in Bip64
        objGetUTXOResponse.pushKV("chainHeight", active_height);
        objGetUTXOResponse.pushKV("chaintipHash", active_hash.GetHex());
        objGetUTXOResponse.pushKV("bitmap", bitmapStringRepresentation);

        UniValue utxos(UniValue::VARR);
        for (const CCoin& coin : outs) {
            UniValue utxo(UniValue::VOBJ);
            utxo.pushKV("height", (int32_t)coin.nHeight);
            utxo.pushKV("value", ValueFromAmount(coin.out.nValue));

            // include the script in a json output
            UniValue o(UniValue::VOBJ);
            ScriptToUniv(coin.out.scriptPubKey, /*out=*/o, /*include_hex=*/true, /*include_address=*/true);
            utxo.pushKV("scriptPubKey", std::move(o));
            utxos.push_back(std::move(utxo));
        }
        objGetUTXOResponse.pushKV("utxos", std::move(utxos));

        // return json string
        std::string strJSON = objGetUTXOResponse.write() + "\n";
        req->WriteHeader("Content-Type", "application/json");
        req->WriteReply(HTTP_OK, strJSON);
        return true;
    }
    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: " + AvailableDataFormatsString() + ")");
    }
    }
}